

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTaskIIF::execute(LineBufferTaskIIF *this)

{
  long lVar1;
  ushort uVar2;
  LineBuffer *pLVar3;
  Data *pDVar4;
  unsigned_long uVar5;
  pointer psVar6;
  pointer psVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  unsigned_short uVar12;
  unsigned_short uVar13;
  unsigned_short uVar14;
  unsigned_short uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  int iVar50;
  undefined4 uVar51;
  uint uVar52;
  uint uVar53;
  size_t sVar54;
  LogicExc *this_00;
  size_t sVar55;
  uint uVar56;
  unsigned_short **outWritePointerRight;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  uint y;
  ulong uVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [12];
  undefined1 auVar68 [12];
  undefined1 auVar69 [12];
  undefined1 auVar70 [12];
  undefined1 auVar71 [12];
  undefined2 uVar82;
  undefined2 uVar83;
  undefined1 auVar72 [16];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [12];
  undefined1 auVar77 [16];
  undefined1 auVar84 [12];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar85 [12];
  undefined1 auVar97 [16];
  undefined1 auVar86 [12];
  undefined1 auVar100 [16];
  undefined1 auVar87 [12];
  undefined1 auVar103 [16];
  undefined1 auVar88 [12];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar89 [12];
  undefined1 auVar110 [16];
  undefined1 auVar90 [12];
  undefined1 auVar113 [16];
  undefined1 auVar91 [12];
  undefined1 auVar116 [16];
  undefined4 uVar118;
  undefined1 auVar120 [12];
  undefined1 auVar121 [12];
  undefined1 auVar122 [12];
  undefined1 auVar123 [12];
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar126 [12];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined1 auVar145 [12];
  undefined1 auVar146 [12];
  undefined1 auVar147 [12];
  undefined1 auVar148 [12];
  undefined1 auVar149 [12];
  undefined1 auVar150 [12];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar183 [16];
  undefined1 auVar187 [16];
  undefined1 auVar191 [16];
  undefined1 auVar195 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar211 [16];
  undefined1 auVar215 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  undefined1 auVar259 [16];
  undefined1 auVar262 [16];
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  size_t pixelsToCopySSE;
  size_t pixelsToCopyNormal;
  unsigned_short *local_a8;
  unsigned_short *local_a0;
  undefined1 local_98 [8];
  unsigned_short *puStack_90;
  undefined1 (*local_88) [16];
  unsigned_short *puStack_80;
  undefined1 local_78 [8];
  unsigned_short *puStack_70;
  undefined1 (*local_68) [16];
  undefined2 *puStack_60;
  size_t local_58;
  size_t local_50;
  LineBufferTaskIIF *local_48;
  long local_40;
  int local_38;
  uint local_34;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar92 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [12];
  undefined1 auVar128 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar134 [16];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar140 [16];
  undefined1 auVar142 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar184 [16];
  undefined1 auVar188 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar200 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar220 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar189 [16];
  undefined1 auVar193 [16];
  undefined1 auVar197 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar257 [16];
  undefined1 auVar260 [16];
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  
  pLVar3 = this->_lineBuffer;
  local_48 = this;
  if ((pLVar3->buffer)._size == 0) {
    pDVar4 = this->_ifd;
    iVar50 = *(int *)((long)&pLVar3->dataPtr + 4);
    iVar57 = pLVar3->dataSize;
    if (pDVar4->maxY < pLVar3->dataSize) {
      iVar57 = pDVar4->maxY;
    }
    if (iVar57 < iVar50) {
      uVar61 = 0;
    }
    else {
      lVar58 = (long)(iVar50 - pDVar4->minY) + -1;
      uVar61 = 0;
      do {
        uVar61 = uVar61 + (pDVar4->bytesPerLine).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar58 + 1];
        lVar58 = lVar58 + 1;
      } while (lVar58 < iVar57 - pDVar4->minY);
    }
    if (((long *)pLVar3->endOfLineBufferData == (long *)0x0) ||
       (uVar61 <= (ulong)(long)*(int *)&pLVar3->dataPtr)) {
      pLVar3->minY = 1;
      (pLVar3->buffer)._size = (long)(pLVar3->buffer)._data;
    }
    else {
      iVar50 = (**(code **)(*(long *)pLVar3->endOfLineBufferData + 0x18))();
      pLVar3 = this->_lineBuffer;
      pLVar3->minY = iVar50;
      uVar51 = (**(code **)(*(long *)pLVar3->endOfLineBufferData + 0x30))
                         (pLVar3->endOfLineBufferData,(pLVar3->buffer)._data,
                          *(undefined4 *)&pLVar3->dataPtr,
                          *(undefined4 *)((long)&pLVar3->dataPtr + 4));
      *(undefined4 *)&this->_lineBuffer->dataPtr = uVar51;
    }
  }
  local_34 = this->_scanLineMax + 1;
  y = this->_scanLineMin;
  uVar56 = y - 1;
  bVar62 = this->_ifd->lineOrder == INCREASING_Y;
  if (!bVar62) {
    y = this->_scanLineMax;
    local_34 = uVar56;
  }
  if (y != local_34) {
    iVar50 = (uint)bVar62 * 2 + -1;
    local_38 = iVar50;
    uVar56 = local_34;
    do {
      uVar53 = (this->_optimizationMode)._ySampling;
      if ((int)y < 0) {
        if (-1 < (int)uVar53) {
          uVar52 = (~y + uVar53) / uVar53;
          goto LAB_001d8046;
        }
        uVar52 = (~uVar53 - y) / -uVar53;
      }
      else if ((int)uVar53 < 0) {
        uVar52 = y / -uVar53;
LAB_001d8046:
        uVar52 = -uVar52;
      }
      else {
        uVar52 = y / uVar53;
      }
      if (y == uVar52 * uVar53) {
        pDVar4 = this->_ifd;
        lVar58 = (this->_lineBuffer->buffer)._size;
        uVar5 = (pDVar4->offsetInLineBuffer).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[(long)(int)y - (long)pDVar4->minY];
        local_58 = 0;
        local_50 = 0;
        local_a0 = (unsigned_short *)0x0;
        local_a8 = (unsigned_short *)0x0;
        psVar6 = (pDVar4->optimizationData).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = (pDVar4->optimizationData).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_40 = (long)psVar7 - (long)psVar6;
        uVar61 = (local_40 >> 3) * 0x6db6db6db6db6db7;
        iVar50 = 0;
        outWritePointerRight = &local_a8;
        if (uVar61 < 5) {
LAB_001d8110:
          getWritePointer<half>(this,y,outWritePointerRight,&local_58,&local_50,iVar50);
        }
        else {
          getWritePointer<half>(this,y,&local_a8,&local_58,&local_50,0);
          if (local_a8 != (unsigned_short *)0x0) {
            outWritePointerRight = &local_a0;
            iVar50 = 1;
            this = local_48;
            goto LAB_001d8110;
          }
        }
        sVar54 = local_50;
        sVar55 = local_58;
        this = local_48;
        iVar50 = local_38;
        uVar56 = local_34;
        if ((local_a8 != (unsigned_short *)0x0 || local_58 != 0) || local_50 != 0) {
          if (psVar7 != psVar6) {
            lVar1 = local_50 + local_58 * 8;
            lVar59 = 2;
            lVar60 = 0;
            do {
              *(unsigned_long *)(local_98 + lVar60 * 8) =
                   (long)(&((pDVar4->optimizationData).
                            super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->base)[lVar59] * lVar1 * 2 +
                   lVar58 + uVar5;
              lVar60 = lVar60 + 1;
              lVar59 = lVar59 + 7;
            } while (uVar61 + (uVar61 == 0) != lVar60);
          }
          if ((uVar61 == 3) || (uVar61 == 6)) {
            optimizedWriteToRGB((unsigned_short **)local_98,(unsigned_short **)(local_98 + 8),
                                (unsigned_short **)&local_88,&local_a8,&local_58,&local_50);
            this = local_48;
            iVar50 = local_38;
            uVar56 = local_34;
            if (local_40 == 0x150) {
              optimizedWriteToRGB(&puStack_80,(unsigned_short **)local_78,
                                  (unsigned_short **)(local_78 + 8),&local_a0,&local_58,&local_50);
              this = local_48;
              iVar50 = local_38;
              uVar56 = local_34;
            }
          }
          else {
            if ((uVar61 != 8) && (uVar61 != 4)) {
              this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::LogicExc::LogicExc(this_00,"IIF mode called with incorrect channel pattern");
              __cxa_throw(this_00,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
            }
            psVar6 = (pDVar4->optimizationData).
                     super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (psVar6[3].fill == true) {
              uVar2 = psVar6[3].fillValue._h;
              uVar61 = (ulong)puStack_90 | (ulong)local_98 | (ulong)local_88;
              uVar56 = (uint)uVar2;
              if ((((ulong)local_a8 & 0xf) == 0) || ((uVar61 & 0xf) == 0)) {
                bVar62 = ((ulong)local_a8 & 0xf) != 0;
                if (((uVar61 & 0xf) == 0) || (bVar62)) {
                  bVar63 = (uVar61 & 0xf) != 0;
                  if ((((ulong)local_a8 & 0xf) == 0) || (bVar63)) {
                    if ((!bVar62 && !bVar63) && (sVar55 != 0)) {
                      auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                      do {
                        auVar93 = *(undefined1 (*) [16])local_98;
                        uVar8 = puStack_90[4];
                        uVar9 = puStack_90[5];
                        uVar10 = puStack_90[6];
                        uVar11 = puStack_90[7];
                        auVar76 = *local_88;
                        auVar186._0_12_ = auVar93._0_12_;
                        auVar186._12_2_ = auVar93._6_2_;
                        auVar186._14_2_ = puStack_90[3];
                        auVar185._12_4_ = auVar186._12_4_;
                        auVar185._0_10_ = auVar93._0_10_;
                        auVar185._10_2_ = puStack_90[2];
                        auVar184._10_6_ = auVar185._10_6_;
                        auVar184._0_8_ = auVar93._0_8_;
                        auVar184._8_2_ = auVar93._4_2_;
                        auVar30._4_8_ = auVar184._8_8_;
                        auVar30._2_2_ = puStack_90[1];
                        auVar30._0_2_ = auVar93._2_2_;
                        auVar183._0_4_ = CONCAT22(*puStack_90,auVar93._0_2_);
                        auVar183._4_12_ = auVar30;
                        uVar83 = auVar72._2_2_;
                        auVar243._0_12_ = auVar76._0_12_;
                        auVar243._12_2_ = auVar76._6_2_;
                        auVar243._14_2_ = uVar83;
                        uVar82 = auVar72._0_2_;
                        auVar242._12_4_ = auVar243._12_4_;
                        auVar242._0_10_ = auVar76._0_10_;
                        auVar242._10_2_ = uVar82;
                        auVar241._10_6_ = auVar242._10_6_;
                        auVar241._0_8_ = auVar76._0_8_;
                        auVar241._8_2_ = auVar76._4_2_;
                        auVar31._4_8_ = auVar241._8_8_;
                        auVar31._2_2_ = uVar83;
                        auVar31._0_2_ = auVar76._2_2_;
                        auVar277._0_8_ = auVar183._0_8_;
                        auVar277._8_4_ = auVar30._0_4_;
                        auVar277._12_4_ = auVar31._0_4_;
                        *(ulong *)local_a8 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar183._0_4_)
                        ;
                        *(long *)(local_a8 + 4) = auVar277._8_8_;
                        *(int *)(local_a8 + 8) = auVar184._8_4_;
                        *(int *)(local_a8 + 10) = auVar241._8_4_;
                        *(undefined4 *)(local_a8 + 0xc) = auVar185._12_4_;
                        *(undefined4 *)(local_a8 + 0xe) = auVar242._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                        auVar87._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                        auVar87._8_2_ = auVar93._12_2_;
                        auVar87._10_2_ = uVar10;
                        auVar102._12_2_ = auVar93._14_2_;
                        auVar102._0_12_ = auVar87;
                        auVar102._14_2_ = uVar11;
                        uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                        auVar146._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                        auVar146._8_2_ = auVar76._12_2_;
                        auVar146._10_2_ = uVar82;
                        auVar154._12_2_ = auVar76._14_2_;
                        auVar154._0_12_ = auVar146;
                        auVar154._14_2_ = uVar83;
                        auVar133._8_4_ = (int)((ulong)auVar87._0_8_ >> 0x20);
                        auVar133._0_8_ = auVar87._0_8_;
                        auVar133._12_4_ = (int)((ulong)auVar146._0_8_ >> 0x20);
                        *(ulong *)(local_a8 + 0x10) = CONCAT44(uVar118,uVar51);
                        *(long *)(local_a8 + 0x14) = auVar133._8_8_;
                        *(int *)(local_a8 + 0x18) = auVar87._8_4_;
                        *(int *)(local_a8 + 0x1a) = auVar146._8_4_;
                        *(int *)(local_a8 + 0x1c) = auVar102._12_4_;
                        *(int *)(local_a8 + 0x1e) = auVar154._12_4_;
                        local_a8 = local_a8 + 0x20;
                        local_88 = local_88 + 1;
                        local_98 = (undefined1  [8])((long)local_98 + 0x10);
                        puStack_90 = puStack_90 + 8;
                        sVar55 = sVar55 - 1;
                      } while (sVar55 != 0);
                    }
                  }
                  else if (sVar55 != 0) {
                    auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                    do {
                      auVar93 = *(undefined1 (*) [16])local_98;
                      uVar8 = puStack_90[4];
                      uVar9 = puStack_90[5];
                      uVar10 = puStack_90[6];
                      uVar11 = puStack_90[7];
                      auVar76 = *local_88;
                      auVar178._0_12_ = auVar93._0_12_;
                      auVar178._12_2_ = auVar93._6_2_;
                      auVar178._14_2_ = puStack_90[3];
                      auVar177._12_4_ = auVar178._12_4_;
                      auVar177._0_10_ = auVar93._0_10_;
                      auVar177._10_2_ = puStack_90[2];
                      auVar176._10_6_ = auVar177._10_6_;
                      auVar176._0_8_ = auVar93._0_8_;
                      auVar176._8_2_ = auVar93._4_2_;
                      auVar26._4_8_ = auVar176._8_8_;
                      auVar26._2_2_ = puStack_90[1];
                      auVar26._0_2_ = auVar93._2_2_;
                      auVar175._0_4_ = CONCAT22(*puStack_90,auVar93._0_2_);
                      auVar175._4_12_ = auVar26;
                      uVar83 = auVar72._2_2_;
                      auVar237._0_12_ = auVar76._0_12_;
                      auVar237._12_2_ = auVar76._6_2_;
                      auVar237._14_2_ = uVar83;
                      uVar82 = auVar72._0_2_;
                      auVar236._12_4_ = auVar237._12_4_;
                      auVar236._0_10_ = auVar76._0_10_;
                      auVar236._10_2_ = uVar82;
                      auVar235._10_6_ = auVar236._10_6_;
                      auVar235._0_8_ = auVar76._0_8_;
                      auVar235._8_2_ = auVar76._4_2_;
                      auVar27._4_8_ = auVar235._8_8_;
                      auVar27._2_2_ = uVar83;
                      auVar27._0_2_ = auVar76._2_2_;
                      auVar275._0_8_ = auVar175._0_8_;
                      auVar275._8_4_ = auVar26._0_4_;
                      auVar275._12_4_ = auVar27._0_4_;
                      *(ulong *)local_a8 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar175._0_4_);
                      *(long *)(local_a8 + 4) = auVar275._8_8_;
                      *(int *)(local_a8 + 8) = auVar176._8_4_;
                      *(int *)(local_a8 + 10) = auVar235._8_4_;
                      *(undefined4 *)(local_a8 + 0xc) = auVar177._12_4_;
                      *(undefined4 *)(local_a8 + 0xe) = auVar236._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                      auVar86._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                      auVar86._8_2_ = auVar93._12_2_;
                      auVar86._10_2_ = uVar10;
                      auVar99._12_2_ = auVar93._14_2_;
                      auVar99._0_12_ = auVar86;
                      auVar99._14_2_ = uVar11;
                      uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                      auVar145._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                      auVar145._8_2_ = auVar76._12_2_;
                      auVar145._10_2_ = uVar82;
                      auVar153._12_2_ = auVar76._14_2_;
                      auVar153._0_12_ = auVar145;
                      auVar153._14_2_ = uVar83;
                      auVar131._8_4_ = (int)((ulong)auVar86._0_8_ >> 0x20);
                      auVar131._0_8_ = auVar86._0_8_;
                      auVar131._12_4_ = (int)((ulong)auVar145._0_8_ >> 0x20);
                      *(ulong *)(local_a8 + 0x10) = CONCAT44(uVar118,uVar51);
                      *(long *)(local_a8 + 0x14) = auVar131._8_8_;
                      *(int *)(local_a8 + 0x18) = auVar86._8_4_;
                      *(int *)(local_a8 + 0x1a) = auVar145._8_4_;
                      *(int *)(local_a8 + 0x1c) = auVar99._12_4_;
                      *(int *)(local_a8 + 0x1e) = auVar153._12_4_;
                      local_a8 = local_a8 + 0x20;
                      local_88 = local_88 + 1;
                      local_98 = (undefined1  [8])((long)local_98 + 0x10);
                      puStack_90 = puStack_90 + 8;
                      sVar55 = sVar55 - 1;
                    } while (sVar55 != 0);
                  }
                }
                else if (sVar55 != 0) {
                  auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                  do {
                    auVar93 = *(undefined1 (*) [16])local_98;
                    uVar8 = puStack_90[4];
                    uVar9 = puStack_90[5];
                    uVar10 = puStack_90[6];
                    uVar11 = puStack_90[7];
                    auVar76 = *local_88;
                    auVar170._0_12_ = auVar93._0_12_;
                    auVar170._12_2_ = auVar93._6_2_;
                    auVar170._14_2_ = puStack_90[3];
                    auVar169._12_4_ = auVar170._12_4_;
                    auVar169._0_10_ = auVar93._0_10_;
                    auVar169._10_2_ = puStack_90[2];
                    auVar168._10_6_ = auVar169._10_6_;
                    auVar168._0_8_ = auVar93._0_8_;
                    auVar168._8_2_ = auVar93._4_2_;
                    auVar22._4_8_ = auVar168._8_8_;
                    auVar22._2_2_ = puStack_90[1];
                    auVar22._0_2_ = auVar93._2_2_;
                    auVar167._0_4_ = CONCAT22(*puStack_90,auVar93._0_2_);
                    auVar167._4_12_ = auVar22;
                    uVar83 = auVar72._2_2_;
                    auVar231._0_12_ = auVar76._0_12_;
                    auVar231._12_2_ = auVar76._6_2_;
                    auVar231._14_2_ = uVar83;
                    uVar82 = auVar72._0_2_;
                    auVar230._12_4_ = auVar231._12_4_;
                    auVar230._0_10_ = auVar76._0_10_;
                    auVar230._10_2_ = uVar82;
                    auVar229._10_6_ = auVar230._10_6_;
                    auVar229._0_8_ = auVar76._0_8_;
                    auVar229._8_2_ = auVar76._4_2_;
                    auVar23._4_8_ = auVar229._8_8_;
                    auVar23._2_2_ = uVar83;
                    auVar23._0_2_ = auVar76._2_2_;
                    auVar273._0_8_ = auVar167._0_8_;
                    auVar273._8_4_ = auVar22._0_4_;
                    auVar273._12_4_ = auVar23._0_4_;
                    *(ulong *)local_a8 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar167._0_4_);
                    *(long *)(local_a8 + 4) = auVar273._8_8_;
                    *(int *)(local_a8 + 8) = auVar168._8_4_;
                    *(int *)(local_a8 + 10) = auVar229._8_4_;
                    *(undefined4 *)(local_a8 + 0xc) = auVar169._12_4_;
                    *(undefined4 *)(local_a8 + 0xe) = auVar230._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                    auVar85._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                    auVar85._8_2_ = auVar93._12_2_;
                    auVar85._10_2_ = uVar10;
                    auVar96._12_2_ = auVar93._14_2_;
                    auVar96._0_12_ = auVar85;
                    auVar96._14_2_ = uVar11;
                    uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                    auVar144._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                    auVar144._8_2_ = auVar76._12_2_;
                    auVar144._10_2_ = uVar82;
                    auVar152._12_2_ = auVar76._14_2_;
                    auVar152._0_12_ = auVar144;
                    auVar152._14_2_ = uVar83;
                    auVar129._8_4_ = (int)((ulong)auVar85._0_8_ >> 0x20);
                    auVar129._0_8_ = auVar85._0_8_;
                    auVar129._12_4_ = (int)((ulong)auVar144._0_8_ >> 0x20);
                    *(ulong *)(local_a8 + 0x10) = CONCAT44(uVar118,uVar51);
                    *(long *)(local_a8 + 0x14) = auVar129._8_8_;
                    *(int *)(local_a8 + 0x18) = auVar85._8_4_;
                    *(int *)(local_a8 + 0x1a) = auVar144._8_4_;
                    *(int *)(local_a8 + 0x1c) = auVar96._12_4_;
                    *(int *)(local_a8 + 0x1e) = auVar152._12_4_;
                    local_a8 = local_a8 + 0x20;
                    local_88 = local_88 + 1;
                    local_98 = (undefined1  [8])((long)local_98 + 0x10);
                    puStack_90 = puStack_90 + 8;
                    sVar55 = sVar55 - 1;
                  } while (sVar55 != 0);
                }
              }
              else if (sVar55 != 0) {
                auVar72 = pshuflw(ZEXT416(uVar56),ZEXT416(uVar56),0);
                do {
                  auVar93 = *(undefined1 (*) [16])local_98;
                  uVar8 = puStack_90[4];
                  uVar9 = puStack_90[5];
                  uVar10 = puStack_90[6];
                  uVar11 = puStack_90[7];
                  auVar76 = *local_88;
                  auVar162._0_12_ = auVar93._0_12_;
                  auVar162._12_2_ = auVar93._6_2_;
                  auVar162._14_2_ = puStack_90[3];
                  auVar161._12_4_ = auVar162._12_4_;
                  auVar161._0_10_ = auVar93._0_10_;
                  auVar161._10_2_ = puStack_90[2];
                  auVar160._10_6_ = auVar161._10_6_;
                  auVar160._0_8_ = auVar93._0_8_;
                  auVar160._8_2_ = auVar93._4_2_;
                  auVar18._4_8_ = auVar160._8_8_;
                  auVar18._2_2_ = puStack_90[1];
                  auVar18._0_2_ = auVar93._2_2_;
                  auVar159._0_4_ = CONCAT22(*puStack_90,auVar93._0_2_);
                  auVar159._4_12_ = auVar18;
                  uVar83 = auVar72._2_2_;
                  auVar225._0_12_ = auVar76._0_12_;
                  auVar225._12_2_ = auVar76._6_2_;
                  auVar225._14_2_ = uVar83;
                  uVar82 = auVar72._0_2_;
                  auVar224._12_4_ = auVar225._12_4_;
                  auVar224._0_10_ = auVar76._0_10_;
                  auVar224._10_2_ = uVar82;
                  auVar223._10_6_ = auVar224._10_6_;
                  auVar223._0_8_ = auVar76._0_8_;
                  auVar223._8_2_ = auVar76._4_2_;
                  auVar19._4_8_ = auVar223._8_8_;
                  auVar19._2_2_ = uVar83;
                  auVar19._0_2_ = auVar76._2_2_;
                  auVar271._0_8_ = auVar159._0_8_;
                  auVar271._8_4_ = auVar18._0_4_;
                  auVar271._12_4_ = auVar19._0_4_;
                  *(ulong *)local_a8 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar159._0_4_);
                  *(long *)(local_a8 + 4) = auVar271._8_8_;
                  *(int *)(local_a8 + 8) = auVar160._8_4_;
                  *(int *)(local_a8 + 10) = auVar223._8_4_;
                  *(undefined4 *)(local_a8 + 0xc) = auVar161._12_4_;
                  *(undefined4 *)(local_a8 + 0xe) = auVar224._12_4_;
                  uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                  auVar84._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                  auVar84._8_2_ = auVar93._12_2_;
                  auVar84._10_2_ = uVar10;
                  auVar92._12_2_ = auVar93._14_2_;
                  auVar92._0_12_ = auVar84;
                  auVar92._14_2_ = uVar11;
                  uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                  auVar143._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                  auVar143._8_2_ = auVar76._12_2_;
                  auVar143._10_2_ = uVar82;
                  auVar151._12_2_ = auVar76._14_2_;
                  auVar151._0_12_ = auVar143;
                  auVar151._14_2_ = uVar83;
                  auVar127._8_4_ = (int)((ulong)auVar84._0_8_ >> 0x20);
                  auVar127._0_8_ = auVar84._0_8_;
                  auVar127._12_4_ = (int)((ulong)auVar143._0_8_ >> 0x20);
                  *(ulong *)(local_a8 + 0x10) = CONCAT44(uVar118,uVar51);
                  *(long *)(local_a8 + 0x14) = auVar127._8_8_;
                  *(int *)(local_a8 + 0x18) = auVar84._8_4_;
                  *(int *)(local_a8 + 0x1a) = auVar143._8_4_;
                  *(int *)(local_a8 + 0x1c) = auVar92._12_4_;
                  *(int *)(local_a8 + 0x1e) = auVar151._12_4_;
                  local_a8 = local_a8 + 0x20;
                  local_88 = local_88 + 1;
                  local_98 = (undefined1  [8])((long)local_98 + 0x10);
                  puStack_90 = puStack_90 + 8;
                  sVar55 = sVar55 - 1;
                } while (sVar55 != 0);
              }
              if (sVar54 != 0) {
                lVar58 = 0;
                sVar55 = 0;
                do {
                  local_a8[sVar55 * 4] = *(unsigned_short *)((long)local_98 + sVar55 * 2);
                  local_a8[sVar55 * 4 + 1] = *(unsigned_short *)((long)puStack_90 + sVar55 * 2);
                  local_a8[sVar55 * 4 + 2] = *(unsigned_short *)(*local_88 + sVar55 * 2);
                  local_a8[sVar55 * 4 + 3] = uVar2;
                  sVar55 = sVar55 + 1;
                  lVar58 = lVar58 + -2;
                } while (sVar54 != sVar55);
                puStack_90 = (unsigned_short *)((long)puStack_90 - lVar58);
                local_98 = (undefined1  [8])((long)local_98 - lVar58);
                local_88 = (undefined1 (*) [16])((long)local_88 - lVar58);
              }
            }
            else {
              auVar72._8_8_ = puStack_80;
              auVar72._0_8_ = local_88;
              auVar72 = _local_98 | auVar72;
              auVar93._0_8_ = auVar72._8_8_;
              auVar93._8_4_ = auVar72._8_4_;
              auVar93._12_4_ = auVar72._12_4_;
              auVar93 = auVar93 | auVar72;
              if ((((ulong)local_a8 & 0xf) == 0) ||
                 ((auVar93 & (undefined1  [16])0xf) == (undefined1  [16])0x0)) {
                bVar62 = ((ulong)local_a8 & 0xf) != 0;
                if (((auVar93 & (undefined1  [16])0xf) == (undefined1  [16])0x0) || (bVar62)) {
                  bVar63 = (auVar93 & (undefined1  [16])0xf) != (undefined1  [16])0x0;
                  if ((((ulong)local_a8 & 0xf) == 0) || (bVar63)) {
                    if ((!bVar62 && !bVar63) && sVar55 != 0) {
                      do {
                        auVar72 = *(undefined1 (*) [16])local_98;
                        uVar8 = puStack_90[4];
                        uVar9 = puStack_90[5];
                        uVar10 = puStack_90[6];
                        uVar11 = puStack_90[7];
                        auVar93 = *local_88;
                        uVar12 = puStack_80[4];
                        uVar13 = puStack_80[5];
                        uVar14 = puStack_80[6];
                        uVar15 = puStack_80[7];
                        auVar190._0_12_ = auVar72._0_12_;
                        auVar190._12_2_ = auVar72._6_2_;
                        auVar190._14_2_ = puStack_90[3];
                        auVar189._12_4_ = auVar190._12_4_;
                        auVar189._0_10_ = auVar72._0_10_;
                        auVar189._10_2_ = puStack_90[2];
                        auVar188._10_6_ = auVar189._10_6_;
                        auVar188._0_8_ = auVar72._0_8_;
                        auVar188._8_2_ = auVar72._4_2_;
                        auVar32._4_8_ = auVar188._8_8_;
                        auVar32._2_2_ = puStack_90[1];
                        auVar32._0_2_ = auVar72._2_2_;
                        auVar187._0_4_ = CONCAT22(*puStack_90,auVar72._0_2_);
                        auVar187._4_12_ = auVar32;
                        auVar246._0_12_ = auVar93._0_12_;
                        auVar246._12_2_ = auVar93._6_2_;
                        auVar246._14_2_ = puStack_80[3];
                        auVar245._12_4_ = auVar246._12_4_;
                        auVar245._0_10_ = auVar93._0_10_;
                        auVar245._10_2_ = puStack_80[2];
                        auVar244._10_6_ = auVar245._10_6_;
                        auVar244._0_8_ = auVar93._0_8_;
                        auVar244._8_2_ = auVar93._4_2_;
                        auVar33._4_8_ = auVar244._8_8_;
                        auVar33._2_2_ = puStack_80[1];
                        auVar33._0_2_ = auVar93._2_2_;
                        auVar278._0_8_ = auVar187._0_8_;
                        auVar278._8_4_ = auVar32._0_4_;
                        auVar278._12_4_ = auVar33._0_4_;
                        *(ulong *)local_a8 =
                             CONCAT44(CONCAT22(*puStack_80,auVar93._0_2_),auVar187._0_4_);
                        *(long *)(local_a8 + 4) = auVar278._8_8_;
                        *(int *)(local_a8 + 8) = auVar188._8_4_;
                        *(int *)(local_a8 + 10) = auVar244._8_4_;
                        *(undefined4 *)(local_a8 + 0xc) = auVar189._12_4_;
                        *(undefined4 *)(local_a8 + 0xe) = auVar245._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                        auVar67._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                        auVar67._8_2_ = auVar72._12_2_;
                        auVar67._10_2_ = uVar10;
                        auVar76._12_2_ = auVar72._14_2_;
                        auVar76._0_12_ = auVar67;
                        auVar76._14_2_ = uVar11;
                        uVar118 = CONCAT22(uVar12,auVar93._8_2_);
                        auVar122._0_8_ = CONCAT26(uVar13,CONCAT24(auVar93._10_2_,uVar118));
                        auVar122._8_2_ = auVar93._12_2_;
                        auVar122._10_2_ = uVar14;
                        auVar134._12_2_ = auVar93._14_2_;
                        auVar134._0_12_ = auVar122;
                        auVar134._14_2_ = uVar15;
                        auVar104._8_4_ = (int)((ulong)auVar67._0_8_ >> 0x20);
                        auVar104._0_8_ = auVar67._0_8_;
                        auVar104._12_4_ = (int)((ulong)auVar122._0_8_ >> 0x20);
                        auVar103._8_8_ = auVar104._8_8_;
                        auVar103._4_4_ = uVar118;
                        auVar103._0_4_ = uVar51;
                        *(undefined1 (*) [16])(local_a8 + 0x10) = auVar103;
                        *(int *)(local_a8 + 0x18) = auVar67._8_4_;
                        *(int *)(local_a8 + 0x1a) = auVar122._8_4_;
                        *(int *)(local_a8 + 0x1c) = auVar76._12_4_;
                        *(int *)(local_a8 + 0x1e) = auVar134._12_4_;
                        local_a8 = local_a8 + 0x20;
                        local_88 = local_88 + 1;
                        puStack_80 = puStack_80 + 8;
                        puStack_90 = puStack_90 + 8;
                        local_98 = (undefined1  [8])((long)local_98 + 0x10);
                        sVar55 = sVar55 - 1;
                      } while (sVar55 != 0);
                    }
                  }
                  else {
                    for (; sVar55 != 0; sVar55 = sVar55 - 1) {
                      auVar72 = *(undefined1 (*) [16])local_98;
                      uVar8 = puStack_90[4];
                      uVar9 = puStack_90[5];
                      uVar10 = puStack_90[6];
                      uVar11 = puStack_90[7];
                      auVar93 = *local_88;
                      uVar12 = puStack_80[4];
                      uVar13 = puStack_80[5];
                      uVar14 = puStack_80[6];
                      uVar15 = puStack_80[7];
                      auVar182._0_12_ = auVar72._0_12_;
                      auVar182._12_2_ = auVar72._6_2_;
                      auVar182._14_2_ = puStack_90[3];
                      auVar181._12_4_ = auVar182._12_4_;
                      auVar181._0_10_ = auVar72._0_10_;
                      auVar181._10_2_ = puStack_90[2];
                      auVar180._10_6_ = auVar181._10_6_;
                      auVar180._0_8_ = auVar72._0_8_;
                      auVar180._8_2_ = auVar72._4_2_;
                      auVar28._4_8_ = auVar180._8_8_;
                      auVar28._2_2_ = puStack_90[1];
                      auVar28._0_2_ = auVar72._2_2_;
                      auVar179._0_4_ = CONCAT22(*puStack_90,auVar72._0_2_);
                      auVar179._4_12_ = auVar28;
                      auVar240._0_12_ = auVar93._0_12_;
                      auVar240._12_2_ = auVar93._6_2_;
                      auVar240._14_2_ = puStack_80[3];
                      auVar239._12_4_ = auVar240._12_4_;
                      auVar239._0_10_ = auVar93._0_10_;
                      auVar239._10_2_ = puStack_80[2];
                      auVar238._10_6_ = auVar239._10_6_;
                      auVar238._0_8_ = auVar93._0_8_;
                      auVar238._8_2_ = auVar93._4_2_;
                      auVar29._4_8_ = auVar238._8_8_;
                      auVar29._2_2_ = puStack_80[1];
                      auVar29._0_2_ = auVar93._2_2_;
                      auVar276._0_8_ = auVar179._0_8_;
                      auVar276._8_4_ = auVar28._0_4_;
                      auVar276._12_4_ = auVar29._0_4_;
                      *(ulong *)local_a8 =
                           CONCAT44(CONCAT22(*puStack_80,auVar93._0_2_),auVar179._0_4_);
                      *(long *)(local_a8 + 4) = auVar276._8_8_;
                      *(int *)(local_a8 + 8) = auVar180._8_4_;
                      *(int *)(local_a8 + 10) = auVar238._8_4_;
                      *(undefined4 *)(local_a8 + 0xc) = auVar181._12_4_;
                      *(undefined4 *)(local_a8 + 0xe) = auVar239._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                      auVar66._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                      auVar66._8_2_ = auVar72._12_2_;
                      auVar66._10_2_ = uVar10;
                      auVar75._12_2_ = auVar72._14_2_;
                      auVar75._0_12_ = auVar66;
                      auVar75._14_2_ = uVar11;
                      uVar118 = CONCAT22(uVar12,auVar93._8_2_);
                      auVar121._0_8_ = CONCAT26(uVar13,CONCAT24(auVar93._10_2_,uVar118));
                      auVar121._8_2_ = auVar93._12_2_;
                      auVar121._10_2_ = uVar14;
                      auVar132._12_2_ = auVar93._14_2_;
                      auVar132._0_12_ = auVar121;
                      auVar132._14_2_ = uVar15;
                      auVar101._8_4_ = (int)((ulong)auVar66._0_8_ >> 0x20);
                      auVar101._0_8_ = auVar66._0_8_;
                      auVar101._12_4_ = (int)((ulong)auVar121._0_8_ >> 0x20);
                      auVar100._8_8_ = auVar101._8_8_;
                      auVar100._4_4_ = uVar118;
                      auVar100._0_4_ = uVar51;
                      *(undefined1 (*) [16])(local_a8 + 0x10) = auVar100;
                      *(int *)(local_a8 + 0x18) = auVar66._8_4_;
                      *(int *)(local_a8 + 0x1a) = auVar121._8_4_;
                      *(int *)(local_a8 + 0x1c) = auVar75._12_4_;
                      *(int *)(local_a8 + 0x1e) = auVar132._12_4_;
                      local_a8 = local_a8 + 0x20;
                      local_88 = local_88 + 1;
                      puStack_80 = puStack_80 + 8;
                      puStack_90 = puStack_90 + 8;
                      local_98 = (undefined1  [8])((long)local_98 + 0x10);
                    }
                  }
                }
                else {
                  for (; sVar55 != 0; sVar55 = sVar55 - 1) {
                    auVar72 = *(undefined1 (*) [16])local_98;
                    uVar8 = puStack_90[4];
                    uVar9 = puStack_90[5];
                    uVar10 = puStack_90[6];
                    uVar11 = puStack_90[7];
                    auVar93 = *local_88;
                    uVar12 = puStack_80[4];
                    uVar13 = puStack_80[5];
                    uVar14 = puStack_80[6];
                    uVar15 = puStack_80[7];
                    auVar174._0_12_ = auVar72._0_12_;
                    auVar174._12_2_ = auVar72._6_2_;
                    auVar174._14_2_ = puStack_90[3];
                    auVar173._12_4_ = auVar174._12_4_;
                    auVar173._0_10_ = auVar72._0_10_;
                    auVar173._10_2_ = puStack_90[2];
                    auVar172._10_6_ = auVar173._10_6_;
                    auVar172._0_8_ = auVar72._0_8_;
                    auVar172._8_2_ = auVar72._4_2_;
                    auVar24._4_8_ = auVar172._8_8_;
                    auVar24._2_2_ = puStack_90[1];
                    auVar24._0_2_ = auVar72._2_2_;
                    auVar171._0_4_ = CONCAT22(*puStack_90,auVar72._0_2_);
                    auVar171._4_12_ = auVar24;
                    auVar234._0_12_ = auVar93._0_12_;
                    auVar234._12_2_ = auVar93._6_2_;
                    auVar234._14_2_ = puStack_80[3];
                    auVar233._12_4_ = auVar234._12_4_;
                    auVar233._0_10_ = auVar93._0_10_;
                    auVar233._10_2_ = puStack_80[2];
                    auVar232._10_6_ = auVar233._10_6_;
                    auVar232._0_8_ = auVar93._0_8_;
                    auVar232._8_2_ = auVar93._4_2_;
                    auVar25._4_8_ = auVar232._8_8_;
                    auVar25._2_2_ = puStack_80[1];
                    auVar25._0_2_ = auVar93._2_2_;
                    auVar274._0_8_ = auVar171._0_8_;
                    auVar274._8_4_ = auVar24._0_4_;
                    auVar274._12_4_ = auVar25._0_4_;
                    *(ulong *)local_a8 =
                         CONCAT44(CONCAT22(*puStack_80,auVar93._0_2_),auVar171._0_4_);
                    *(long *)(local_a8 + 4) = auVar274._8_8_;
                    *(int *)(local_a8 + 8) = auVar172._8_4_;
                    *(int *)(local_a8 + 10) = auVar232._8_4_;
                    *(undefined4 *)(local_a8 + 0xc) = auVar173._12_4_;
                    *(undefined4 *)(local_a8 + 0xe) = auVar233._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                    auVar65._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                    auVar65._8_2_ = auVar72._12_2_;
                    auVar65._10_2_ = uVar10;
                    auVar74._12_2_ = auVar72._14_2_;
                    auVar74._0_12_ = auVar65;
                    auVar74._14_2_ = uVar11;
                    uVar118 = CONCAT22(uVar12,auVar93._8_2_);
                    auVar120._0_8_ = CONCAT26(uVar13,CONCAT24(auVar93._10_2_,uVar118));
                    auVar120._8_2_ = auVar93._12_2_;
                    auVar120._10_2_ = uVar14;
                    auVar130._12_2_ = auVar93._14_2_;
                    auVar130._0_12_ = auVar120;
                    auVar130._14_2_ = uVar15;
                    auVar98._8_4_ = (int)((ulong)auVar65._0_8_ >> 0x20);
                    auVar98._0_8_ = auVar65._0_8_;
                    auVar98._12_4_ = (int)((ulong)auVar120._0_8_ >> 0x20);
                    auVar97._8_8_ = auVar98._8_8_;
                    auVar97._4_4_ = uVar118;
                    auVar97._0_4_ = uVar51;
                    *(undefined1 (*) [16])(local_a8 + 0x10) = auVar97;
                    *(int *)(local_a8 + 0x18) = auVar65._8_4_;
                    *(int *)(local_a8 + 0x1a) = auVar120._8_4_;
                    *(int *)(local_a8 + 0x1c) = auVar74._12_4_;
                    *(int *)(local_a8 + 0x1e) = auVar130._12_4_;
                    local_a8 = local_a8 + 0x20;
                    local_88 = local_88 + 1;
                    puStack_80 = puStack_80 + 8;
                    puStack_90 = puStack_90 + 8;
                    local_98 = (undefined1  [8])((long)local_98 + 0x10);
                  }
                }
              }
              else {
                for (; sVar55 != 0; sVar55 = sVar55 - 1) {
                  auVar72 = *(undefined1 (*) [16])local_98;
                  uVar8 = puStack_90[4];
                  uVar9 = puStack_90[5];
                  uVar10 = puStack_90[6];
                  uVar11 = puStack_90[7];
                  auVar93 = *local_88;
                  uVar12 = puStack_80[4];
                  uVar13 = puStack_80[5];
                  uVar14 = puStack_80[6];
                  uVar15 = puStack_80[7];
                  auVar166._0_12_ = auVar72._0_12_;
                  auVar166._12_2_ = auVar72._6_2_;
                  auVar166._14_2_ = puStack_90[3];
                  auVar165._12_4_ = auVar166._12_4_;
                  auVar165._0_10_ = auVar72._0_10_;
                  auVar165._10_2_ = puStack_90[2];
                  auVar164._10_6_ = auVar165._10_6_;
                  auVar164._0_8_ = auVar72._0_8_;
                  auVar164._8_2_ = auVar72._4_2_;
                  auVar20._4_8_ = auVar164._8_8_;
                  auVar20._2_2_ = puStack_90[1];
                  auVar20._0_2_ = auVar72._2_2_;
                  auVar163._0_4_ = CONCAT22(*puStack_90,auVar72._0_2_);
                  auVar163._4_12_ = auVar20;
                  auVar228._0_12_ = auVar93._0_12_;
                  auVar228._12_2_ = auVar93._6_2_;
                  auVar228._14_2_ = puStack_80[3];
                  auVar227._12_4_ = auVar228._12_4_;
                  auVar227._0_10_ = auVar93._0_10_;
                  auVar227._10_2_ = puStack_80[2];
                  auVar226._10_6_ = auVar227._10_6_;
                  auVar226._0_8_ = auVar93._0_8_;
                  auVar226._8_2_ = auVar93._4_2_;
                  auVar21._4_8_ = auVar226._8_8_;
                  auVar21._2_2_ = puStack_80[1];
                  auVar21._0_2_ = auVar93._2_2_;
                  auVar272._0_8_ = auVar163._0_8_;
                  auVar272._8_4_ = auVar20._0_4_;
                  auVar272._12_4_ = auVar21._0_4_;
                  *(ulong *)local_a8 = CONCAT44(CONCAT22(*puStack_80,auVar93._0_2_),auVar163._0_4_);
                  *(long *)(local_a8 + 4) = auVar272._8_8_;
                  *(int *)(local_a8 + 8) = auVar164._8_4_;
                  *(int *)(local_a8 + 10) = auVar226._8_4_;
                  *(undefined4 *)(local_a8 + 0xc) = auVar165._12_4_;
                  *(undefined4 *)(local_a8 + 0xe) = auVar227._12_4_;
                  uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                  auVar64._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                  auVar64._8_2_ = auVar72._12_2_;
                  auVar64._10_2_ = uVar10;
                  auVar73._12_2_ = auVar72._14_2_;
                  auVar73._0_12_ = auVar64;
                  auVar73._14_2_ = uVar11;
                  uVar118 = CONCAT22(uVar12,auVar93._8_2_);
                  auVar119._0_8_ = CONCAT26(uVar13,CONCAT24(auVar93._10_2_,uVar118));
                  auVar119._8_2_ = auVar93._12_2_;
                  auVar119._10_2_ = uVar14;
                  auVar128._12_2_ = auVar93._14_2_;
                  auVar128._0_12_ = auVar119;
                  auVar128._14_2_ = uVar15;
                  auVar95._8_4_ = (int)((ulong)auVar64._0_8_ >> 0x20);
                  auVar95._0_8_ = auVar64._0_8_;
                  auVar95._12_4_ = (int)((ulong)auVar119._0_8_ >> 0x20);
                  auVar94._8_8_ = auVar95._8_8_;
                  auVar94._4_4_ = uVar118;
                  auVar94._0_4_ = uVar51;
                  *(undefined1 (*) [16])(local_a8 + 0x10) = auVar94;
                  *(int *)(local_a8 + 0x18) = auVar64._8_4_;
                  *(int *)(local_a8 + 0x1a) = auVar119._8_4_;
                  *(int *)(local_a8 + 0x1c) = auVar73._12_4_;
                  *(int *)(local_a8 + 0x1e) = auVar128._12_4_;
                  local_a8 = local_a8 + 0x20;
                  local_88 = local_88 + 1;
                  puStack_80 = puStack_80 + 8;
                  puStack_90 = puStack_90 + 8;
                  local_98 = (undefined1  [8])((long)local_98 + 0x10);
                }
              }
              if (sVar54 != 0) {
                lVar58 = 0;
                do {
                  local_a8[lVar58 * 2] = *(unsigned_short *)((long)local_98 + lVar58);
                  local_a8[lVar58 * 2 + 1] = *(unsigned_short *)((long)puStack_90 + lVar58);
                  local_a8[lVar58 * 2 + 2] = *(unsigned_short *)(*local_88 + lVar58);
                  local_a8[lVar58 * 2 + 3] = *(unsigned_short *)((long)puStack_80 + lVar58);
                  lVar58 = lVar58 + 2;
                  sVar54 = sVar54 - 1;
                } while (sVar54 != 0);
                puStack_90 = (unsigned_short *)((long)puStack_90 + lVar58);
                local_98 = (undefined1  [8])((long)local_98 + lVar58);
                local_88 = (undefined1 (*) [16])(*local_88 + lVar58);
                puStack_80 = (unsigned_short *)((long)puStack_80 + lVar58);
              }
            }
            this = local_48;
            iVar50 = local_38;
            uVar56 = local_34;
            if (local_40 == 0x1c0) {
              psVar6 = (local_48->_ifd->optimizationData).
                       super__Vector_base<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (psVar6[7].fill == true) {
                uVar2 = psVar6[7].fillValue._h;
                uVar61 = (ulong)puStack_70 | (ulong)local_78 | (ulong)local_68;
                uVar53 = (uint)uVar2;
                if (((ulong)local_a0 & 0xf) == 0 || (uVar61 & 0xf) == 0) {
                  bVar62 = ((ulong)local_a0 & 0xf) != 0;
                  if (((uVar61 & 0xf) == 0) || (bVar62)) {
                    bVar63 = (uVar61 & 0xf) != 0;
                    if ((((ulong)local_a0 & 0xf) == 0) || (bVar63)) {
                      if ((!bVar63 && !bVar62) && (local_58 != 0)) {
                        auVar72 = pshuflw(ZEXT416(uVar53),ZEXT416(uVar53),0);
                        do {
                          auVar93 = *(undefined1 (*) [16])local_78;
                          uVar8 = puStack_70[4];
                          uVar9 = puStack_70[5];
                          uVar10 = puStack_70[6];
                          uVar11 = puStack_70[7];
                          auVar76 = *local_68;
                          auVar218._0_12_ = auVar93._0_12_;
                          auVar218._12_2_ = auVar93._6_2_;
                          auVar218._14_2_ = puStack_70[3];
                          auVar217._12_4_ = auVar218._12_4_;
                          auVar217._0_10_ = auVar93._0_10_;
                          auVar217._10_2_ = puStack_70[2];
                          auVar216._10_6_ = auVar217._10_6_;
                          auVar216._0_8_ = auVar93._0_8_;
                          auVar216._8_2_ = auVar93._4_2_;
                          auVar46._4_8_ = auVar216._8_8_;
                          auVar46._2_2_ = puStack_70[1];
                          auVar46._0_2_ = auVar93._2_2_;
                          auVar215._0_4_ = CONCAT22(*puStack_70,auVar93._0_2_);
                          auVar215._4_12_ = auVar46;
                          uVar83 = auVar72._2_2_;
                          auVar267._0_12_ = auVar76._0_12_;
                          auVar267._12_2_ = auVar76._6_2_;
                          auVar267._14_2_ = uVar83;
                          uVar82 = auVar72._0_2_;
                          auVar266._12_4_ = auVar267._12_4_;
                          auVar266._0_10_ = auVar76._0_10_;
                          auVar266._10_2_ = uVar82;
                          auVar265._10_6_ = auVar266._10_6_;
                          auVar265._0_8_ = auVar76._0_8_;
                          auVar265._8_2_ = auVar76._4_2_;
                          auVar47._4_8_ = auVar265._8_8_;
                          auVar47._2_2_ = uVar83;
                          auVar47._0_2_ = auVar76._2_2_;
                          auVar285._0_8_ = auVar215._0_8_;
                          auVar285._8_4_ = auVar46._0_4_;
                          auVar285._12_4_ = auVar47._0_4_;
                          *(ulong *)local_a0 =
                               CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar215._0_4_);
                          *(long *)(local_a0 + 4) = auVar285._8_8_;
                          *(int *)(local_a0 + 8) = auVar216._8_4_;
                          *(int *)(local_a0 + 10) = auVar265._8_4_;
                          *(undefined4 *)(local_a0 + 0xc) = auVar217._12_4_;
                          *(undefined4 *)(local_a0 + 0xe) = auVar266._12_4_;
                          uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                          auVar91._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                          auVar91._8_2_ = auVar93._12_2_;
                          auVar91._10_2_ = uVar10;
                          auVar115._12_2_ = auVar93._14_2_;
                          auVar115._0_12_ = auVar91;
                          auVar115._14_2_ = uVar11;
                          uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                          auVar150._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                          auVar150._8_2_ = auVar76._12_2_;
                          auVar150._10_2_ = uVar82;
                          auVar158._12_2_ = auVar76._14_2_;
                          auVar158._0_12_ = auVar150;
                          auVar158._14_2_ = uVar83;
                          auVar141._8_4_ = (int)((ulong)auVar91._0_8_ >> 0x20);
                          auVar141._0_8_ = auVar91._0_8_;
                          auVar141._12_4_ = (int)((ulong)auVar150._0_8_ >> 0x20);
                          *(ulong *)(local_a0 + 0x10) = CONCAT44(uVar118,uVar51);
                          *(long *)(local_a0 + 0x14) = auVar141._8_8_;
                          *(int *)(local_a0 + 0x18) = auVar91._8_4_;
                          *(int *)(local_a0 + 0x1a) = auVar150._8_4_;
                          *(int *)(local_a0 + 0x1c) = auVar115._12_4_;
                          *(int *)(local_a0 + 0x1e) = auVar158._12_4_;
                          local_a0 = local_a0 + 0x20;
                          local_68 = local_68 + 1;
                          local_78 = (undefined1  [8])((long)local_78 + 0x10);
                          puStack_70 = puStack_70 + 8;
                          local_58 = local_58 - 1;
                        } while (local_58 != 0);
                      }
                    }
                    else if (local_58 != 0) {
                      auVar72 = pshuflw(ZEXT416(uVar53),ZEXT416(uVar53),0);
                      do {
                        auVar93 = *(undefined1 (*) [16])local_78;
                        uVar8 = puStack_70[4];
                        uVar9 = puStack_70[5];
                        uVar10 = puStack_70[6];
                        uVar11 = puStack_70[7];
                        auVar76 = *local_68;
                        auVar210._0_12_ = auVar93._0_12_;
                        auVar210._12_2_ = auVar93._6_2_;
                        auVar210._14_2_ = puStack_70[3];
                        auVar209._12_4_ = auVar210._12_4_;
                        auVar209._0_10_ = auVar93._0_10_;
                        auVar209._10_2_ = puStack_70[2];
                        auVar208._10_6_ = auVar209._10_6_;
                        auVar208._0_8_ = auVar93._0_8_;
                        auVar208._8_2_ = auVar93._4_2_;
                        auVar42._4_8_ = auVar208._8_8_;
                        auVar42._2_2_ = puStack_70[1];
                        auVar42._0_2_ = auVar93._2_2_;
                        auVar207._0_4_ = CONCAT22(*puStack_70,auVar93._0_2_);
                        auVar207._4_12_ = auVar42;
                        uVar83 = auVar72._2_2_;
                        auVar261._0_12_ = auVar76._0_12_;
                        auVar261._12_2_ = auVar76._6_2_;
                        auVar261._14_2_ = uVar83;
                        uVar82 = auVar72._0_2_;
                        auVar260._12_4_ = auVar261._12_4_;
                        auVar260._0_10_ = auVar76._0_10_;
                        auVar260._10_2_ = uVar82;
                        auVar259._10_6_ = auVar260._10_6_;
                        auVar259._0_8_ = auVar76._0_8_;
                        auVar259._8_2_ = auVar76._4_2_;
                        auVar43._4_8_ = auVar259._8_8_;
                        auVar43._2_2_ = uVar83;
                        auVar43._0_2_ = auVar76._2_2_;
                        auVar283._0_8_ = auVar207._0_8_;
                        auVar283._8_4_ = auVar42._0_4_;
                        auVar283._12_4_ = auVar43._0_4_;
                        *(ulong *)local_a0 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar207._0_4_)
                        ;
                        *(long *)(local_a0 + 4) = auVar283._8_8_;
                        *(int *)(local_a0 + 8) = auVar208._8_4_;
                        *(int *)(local_a0 + 10) = auVar259._8_4_;
                        *(undefined4 *)(local_a0 + 0xc) = auVar209._12_4_;
                        *(undefined4 *)(local_a0 + 0xe) = auVar260._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                        auVar90._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                        auVar90._8_2_ = auVar93._12_2_;
                        auVar90._10_2_ = uVar10;
                        auVar112._12_2_ = auVar93._14_2_;
                        auVar112._0_12_ = auVar90;
                        auVar112._14_2_ = uVar11;
                        uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                        auVar149._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                        auVar149._8_2_ = auVar76._12_2_;
                        auVar149._10_2_ = uVar82;
                        auVar157._12_2_ = auVar76._14_2_;
                        auVar157._0_12_ = auVar149;
                        auVar157._14_2_ = uVar83;
                        auVar139._8_4_ = (int)((ulong)auVar90._0_8_ >> 0x20);
                        auVar139._0_8_ = auVar90._0_8_;
                        auVar139._12_4_ = (int)((ulong)auVar149._0_8_ >> 0x20);
                        *(ulong *)(local_a0 + 0x10) = CONCAT44(uVar118,uVar51);
                        *(long *)(local_a0 + 0x14) = auVar139._8_8_;
                        *(int *)(local_a0 + 0x18) = auVar90._8_4_;
                        *(int *)(local_a0 + 0x1a) = auVar149._8_4_;
                        *(int *)(local_a0 + 0x1c) = auVar112._12_4_;
                        *(int *)(local_a0 + 0x1e) = auVar157._12_4_;
                        local_a0 = local_a0 + 0x20;
                        local_68 = local_68 + 1;
                        local_78 = (undefined1  [8])((long)local_78 + 0x10);
                        puStack_70 = puStack_70 + 8;
                        local_58 = local_58 - 1;
                      } while (local_58 != 0);
                    }
                  }
                  else if (local_58 != 0) {
                    auVar72 = pshuflw(ZEXT416(uVar53),ZEXT416(uVar53),0);
                    do {
                      auVar93 = *(undefined1 (*) [16])local_78;
                      uVar8 = puStack_70[4];
                      uVar9 = puStack_70[5];
                      uVar10 = puStack_70[6];
                      uVar11 = puStack_70[7];
                      auVar76 = *local_68;
                      auVar194._0_12_ = auVar93._0_12_;
                      auVar194._12_2_ = auVar93._6_2_;
                      auVar194._14_2_ = puStack_70[3];
                      auVar193._12_4_ = auVar194._12_4_;
                      auVar193._0_10_ = auVar93._0_10_;
                      auVar193._10_2_ = puStack_70[2];
                      auVar192._10_6_ = auVar193._10_6_;
                      auVar192._0_8_ = auVar93._0_8_;
                      auVar192._8_2_ = auVar93._4_2_;
                      auVar34._4_8_ = auVar192._8_8_;
                      auVar34._2_2_ = puStack_70[1];
                      auVar34._0_2_ = auVar93._2_2_;
                      auVar191._0_4_ = CONCAT22(*puStack_70,auVar93._0_2_);
                      auVar191._4_12_ = auVar34;
                      uVar83 = auVar72._2_2_;
                      auVar249._0_12_ = auVar76._0_12_;
                      auVar249._12_2_ = auVar76._6_2_;
                      auVar249._14_2_ = uVar83;
                      uVar82 = auVar72._0_2_;
                      auVar248._12_4_ = auVar249._12_4_;
                      auVar248._0_10_ = auVar76._0_10_;
                      auVar248._10_2_ = uVar82;
                      auVar247._10_6_ = auVar248._10_6_;
                      auVar247._0_8_ = auVar76._0_8_;
                      auVar247._8_2_ = auVar76._4_2_;
                      auVar35._4_8_ = auVar247._8_8_;
                      auVar35._2_2_ = uVar83;
                      auVar35._0_2_ = auVar76._2_2_;
                      auVar279._0_8_ = auVar191._0_8_;
                      auVar279._8_4_ = auVar34._0_4_;
                      auVar279._12_4_ = auVar35._0_4_;
                      *(ulong *)local_a0 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar191._0_4_);
                      *(long *)(local_a0 + 4) = auVar279._8_8_;
                      *(int *)(local_a0 + 8) = auVar192._8_4_;
                      *(int *)(local_a0 + 10) = auVar247._8_4_;
                      *(undefined4 *)(local_a0 + 0xc) = auVar193._12_4_;
                      *(undefined4 *)(local_a0 + 0xe) = auVar248._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                      auVar88._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                      auVar88._8_2_ = auVar93._12_2_;
                      auVar88._10_2_ = uVar10;
                      auVar105._12_2_ = auVar93._14_2_;
                      auVar105._0_12_ = auVar88;
                      auVar105._14_2_ = uVar11;
                      uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                      auVar147._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                      auVar147._8_2_ = auVar76._12_2_;
                      auVar147._10_2_ = uVar82;
                      auVar155._12_2_ = auVar76._14_2_;
                      auVar155._0_12_ = auVar147;
                      auVar155._14_2_ = uVar83;
                      auVar135._8_4_ = (int)((ulong)auVar88._0_8_ >> 0x20);
                      auVar135._0_8_ = auVar88._0_8_;
                      auVar135._12_4_ = (int)((ulong)auVar147._0_8_ >> 0x20);
                      *(ulong *)(local_a0 + 0x10) = CONCAT44(uVar118,uVar51);
                      *(long *)(local_a0 + 0x14) = auVar135._8_8_;
                      *(int *)(local_a0 + 0x18) = auVar88._8_4_;
                      *(int *)(local_a0 + 0x1a) = auVar147._8_4_;
                      *(int *)(local_a0 + 0x1c) = auVar105._12_4_;
                      *(int *)(local_a0 + 0x1e) = auVar155._12_4_;
                      local_a0 = local_a0 + 0x20;
                      local_68 = local_68 + 1;
                      local_78 = (undefined1  [8])((long)local_78 + 0x10);
                      puStack_70 = puStack_70 + 8;
                      local_58 = local_58 - 1;
                    } while (local_58 != 0);
                  }
                }
                else if (local_58 != 0) {
                  auVar72 = pshuflw(ZEXT416(uVar53),ZEXT416(uVar53),0);
                  do {
                    auVar93 = *(undefined1 (*) [16])local_78;
                    uVar8 = puStack_70[4];
                    uVar9 = puStack_70[5];
                    uVar10 = puStack_70[6];
                    uVar11 = puStack_70[7];
                    auVar76 = *local_68;
                    auVar202._0_12_ = auVar93._0_12_;
                    auVar202._12_2_ = auVar93._6_2_;
                    auVar202._14_2_ = puStack_70[3];
                    auVar201._12_4_ = auVar202._12_4_;
                    auVar201._0_10_ = auVar93._0_10_;
                    auVar201._10_2_ = puStack_70[2];
                    auVar200._10_6_ = auVar201._10_6_;
                    auVar200._0_8_ = auVar93._0_8_;
                    auVar200._8_2_ = auVar93._4_2_;
                    auVar38._4_8_ = auVar200._8_8_;
                    auVar38._2_2_ = puStack_70[1];
                    auVar38._0_2_ = auVar93._2_2_;
                    auVar199._0_4_ = CONCAT22(*puStack_70,auVar93._0_2_);
                    auVar199._4_12_ = auVar38;
                    uVar83 = auVar72._2_2_;
                    auVar255._0_12_ = auVar76._0_12_;
                    auVar255._12_2_ = auVar76._6_2_;
                    auVar255._14_2_ = uVar83;
                    uVar82 = auVar72._0_2_;
                    auVar254._12_4_ = auVar255._12_4_;
                    auVar254._0_10_ = auVar76._0_10_;
                    auVar254._10_2_ = uVar82;
                    auVar253._10_6_ = auVar254._10_6_;
                    auVar253._0_8_ = auVar76._0_8_;
                    auVar253._8_2_ = auVar76._4_2_;
                    auVar39._4_8_ = auVar253._8_8_;
                    auVar39._2_2_ = uVar83;
                    auVar39._0_2_ = auVar76._2_2_;
                    auVar281._0_8_ = auVar199._0_8_;
                    auVar281._8_4_ = auVar38._0_4_;
                    auVar281._12_4_ = auVar39._0_4_;
                    *(ulong *)local_a0 = CONCAT44(CONCAT22(uVar82,auVar76._0_2_),auVar199._0_4_);
                    *(long *)(local_a0 + 4) = auVar281._8_8_;
                    *(int *)(local_a0 + 8) = auVar200._8_4_;
                    *(int *)(local_a0 + 10) = auVar253._8_4_;
                    *(undefined4 *)(local_a0 + 0xc) = auVar201._12_4_;
                    *(undefined4 *)(local_a0 + 0xe) = auVar254._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar93._8_2_);
                    auVar89._0_8_ = CONCAT26(uVar9,CONCAT24(auVar93._10_2_,uVar51));
                    auVar89._8_2_ = auVar93._12_2_;
                    auVar89._10_2_ = uVar10;
                    auVar109._12_2_ = auVar93._14_2_;
                    auVar109._0_12_ = auVar89;
                    auVar109._14_2_ = uVar11;
                    uVar118 = CONCAT22(uVar82,auVar76._8_2_);
                    auVar148._0_8_ = CONCAT26(uVar83,CONCAT24(auVar76._10_2_,uVar118));
                    auVar148._8_2_ = auVar76._12_2_;
                    auVar148._10_2_ = uVar82;
                    auVar156._12_2_ = auVar76._14_2_;
                    auVar156._0_12_ = auVar148;
                    auVar156._14_2_ = uVar83;
                    auVar137._8_4_ = (int)((ulong)auVar89._0_8_ >> 0x20);
                    auVar137._0_8_ = auVar89._0_8_;
                    auVar137._12_4_ = (int)((ulong)auVar148._0_8_ >> 0x20);
                    *(ulong *)(local_a0 + 0x10) = CONCAT44(uVar118,uVar51);
                    *(long *)(local_a0 + 0x14) = auVar137._8_8_;
                    *(int *)(local_a0 + 0x18) = auVar89._8_4_;
                    *(int *)(local_a0 + 0x1a) = auVar148._8_4_;
                    *(int *)(local_a0 + 0x1c) = auVar109._12_4_;
                    *(int *)(local_a0 + 0x1e) = auVar156._12_4_;
                    local_a0 = local_a0 + 0x20;
                    local_68 = local_68 + 1;
                    local_78 = (undefined1  [8])((long)local_78 + 0x10);
                    puStack_70 = puStack_70 + 8;
                    local_58 = local_58 - 1;
                  } while (local_58 != 0);
                }
                if (local_50 != 0) {
                  lVar58 = 0;
                  sVar55 = 0;
                  do {
                    local_a0[sVar55 * 4] = *(unsigned_short *)((long)local_78 + sVar55 * 2);
                    local_a0[sVar55 * 4 + 1] = *(unsigned_short *)((long)puStack_70 + sVar55 * 2);
                    local_a0[sVar55 * 4 + 2] = *(unsigned_short *)(*local_68 + sVar55 * 2);
                    local_a0[sVar55 * 4 + 3] = uVar2;
                    sVar55 = sVar55 + 1;
                    lVar58 = lVar58 + -2;
                  } while (local_50 != sVar55);
                  puStack_70 = (unsigned_short *)((long)puStack_70 - lVar58);
                  local_78 = (undefined1  [8])((long)local_78 - lVar58);
                  local_68 = (undefined1 (*) [16])((long)local_68 - lVar58);
                }
              }
              else {
                auVar77._8_8_ = puStack_60;
                auVar77._0_8_ = local_68;
                auVar77 = _local_78 | auVar77;
                auVar106._0_8_ = auVar77._8_8_;
                auVar106._8_4_ = auVar77._8_4_;
                auVar106._12_4_ = auVar77._12_4_;
                auVar106 = auVar106 | auVar77;
                if (((ulong)local_a0 & 0xf) == 0 ||
                    (auVar106 & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
                  bVar62 = ((ulong)local_a0 & 0xf) != 0;
                  if (((auVar106 & (undefined1  [16])0xf) == (undefined1  [16])0x0) || (bVar62)) {
                    bVar63 = (auVar106 & (undefined1  [16])0xf) != (undefined1  [16])0x0;
                    if ((((ulong)local_a0 & 0xf) == 0) || (bVar63)) {
                      if (local_58 != 0 && (!bVar63 && !bVar62)) {
                        do {
                          auVar72 = *(undefined1 (*) [16])local_78;
                          uVar8 = puStack_70[4];
                          uVar9 = puStack_70[5];
                          uVar10 = puStack_70[6];
                          uVar11 = puStack_70[7];
                          auVar93 = *local_68;
                          uVar82 = puStack_60[4];
                          uVar83 = puStack_60[5];
                          uVar16 = puStack_60[6];
                          uVar17 = puStack_60[7];
                          auVar222._0_12_ = auVar72._0_12_;
                          auVar222._12_2_ = auVar72._6_2_;
                          auVar222._14_2_ = puStack_70[3];
                          auVar221._12_4_ = auVar222._12_4_;
                          auVar221._0_10_ = auVar72._0_10_;
                          auVar221._10_2_ = puStack_70[2];
                          auVar220._10_6_ = auVar221._10_6_;
                          auVar220._0_8_ = auVar72._0_8_;
                          auVar220._8_2_ = auVar72._4_2_;
                          auVar48._4_8_ = auVar220._8_8_;
                          auVar48._2_2_ = puStack_70[1];
                          auVar48._0_2_ = auVar72._2_2_;
                          auVar219._0_4_ = CONCAT22(*puStack_70,auVar72._0_2_);
                          auVar219._4_12_ = auVar48;
                          auVar270._0_12_ = auVar93._0_12_;
                          auVar270._12_2_ = auVar93._6_2_;
                          auVar270._14_2_ = puStack_60[3];
                          auVar269._12_4_ = auVar270._12_4_;
                          auVar269._0_10_ = auVar93._0_10_;
                          auVar269._10_2_ = puStack_60[2];
                          auVar268._10_6_ = auVar269._10_6_;
                          auVar268._0_8_ = auVar93._0_8_;
                          auVar268._8_2_ = auVar93._4_2_;
                          auVar49._4_8_ = auVar268._8_8_;
                          auVar49._2_2_ = puStack_60[1];
                          auVar49._0_2_ = auVar93._2_2_;
                          auVar286._0_8_ = auVar219._0_8_;
                          auVar286._8_4_ = auVar48._0_4_;
                          auVar286._12_4_ = auVar49._0_4_;
                          *(ulong *)local_a0 =
                               CONCAT44(CONCAT22(*puStack_60,auVar93._0_2_),auVar219._0_4_);
                          *(long *)(local_a0 + 4) = auVar286._8_8_;
                          *(int *)(local_a0 + 8) = auVar220._8_4_;
                          *(int *)(local_a0 + 10) = auVar268._8_4_;
                          *(undefined4 *)(local_a0 + 0xc) = auVar221._12_4_;
                          *(undefined4 *)(local_a0 + 0xe) = auVar269._12_4_;
                          uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                          auVar71._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                          auVar71._8_2_ = auVar72._12_2_;
                          auVar71._10_2_ = uVar10;
                          auVar81._12_2_ = auVar72._14_2_;
                          auVar81._0_12_ = auVar71;
                          auVar81._14_2_ = uVar11;
                          uVar118 = CONCAT22(uVar82,auVar93._8_2_);
                          auVar126._0_8_ = CONCAT26(uVar83,CONCAT24(auVar93._10_2_,uVar118));
                          auVar126._8_2_ = auVar93._12_2_;
                          auVar126._10_2_ = uVar16;
                          auVar142._12_2_ = auVar93._14_2_;
                          auVar142._0_12_ = auVar126;
                          auVar142._14_2_ = uVar17;
                          auVar117._8_4_ = (int)((ulong)auVar71._0_8_ >> 0x20);
                          auVar117._0_8_ = auVar71._0_8_;
                          auVar117._12_4_ = (int)((ulong)auVar126._0_8_ >> 0x20);
                          auVar116._8_8_ = auVar117._8_8_;
                          auVar116._4_4_ = uVar118;
                          auVar116._0_4_ = uVar51;
                          *(undefined1 (*) [16])(local_a0 + 0x10) = auVar116;
                          *(int *)(local_a0 + 0x18) = auVar71._8_4_;
                          *(int *)(local_a0 + 0x1a) = auVar126._8_4_;
                          *(int *)(local_a0 + 0x1c) = auVar81._12_4_;
                          *(int *)(local_a0 + 0x1e) = auVar142._12_4_;
                          local_a0 = local_a0 + 0x20;
                          local_68 = local_68 + 1;
                          puStack_60 = puStack_60 + 8;
                          puStack_70 = puStack_70 + 8;
                          local_78 = (undefined1  [8])((long)local_78 + 0x10);
                          local_58 = local_58 - 1;
                        } while (local_58 != 0);
                      }
                    }
                    else {
                      for (; local_58 != 0; local_58 = local_58 - 1) {
                        auVar72 = *(undefined1 (*) [16])local_78;
                        uVar8 = puStack_70[4];
                        uVar9 = puStack_70[5];
                        uVar10 = puStack_70[6];
                        uVar11 = puStack_70[7];
                        auVar93 = *local_68;
                        uVar82 = puStack_60[4];
                        uVar83 = puStack_60[5];
                        uVar16 = puStack_60[6];
                        uVar17 = puStack_60[7];
                        auVar214._0_12_ = auVar72._0_12_;
                        auVar214._12_2_ = auVar72._6_2_;
                        auVar214._14_2_ = puStack_70[3];
                        auVar213._12_4_ = auVar214._12_4_;
                        auVar213._0_10_ = auVar72._0_10_;
                        auVar213._10_2_ = puStack_70[2];
                        auVar212._10_6_ = auVar213._10_6_;
                        auVar212._0_8_ = auVar72._0_8_;
                        auVar212._8_2_ = auVar72._4_2_;
                        auVar44._4_8_ = auVar212._8_8_;
                        auVar44._2_2_ = puStack_70[1];
                        auVar44._0_2_ = auVar72._2_2_;
                        auVar211._0_4_ = CONCAT22(*puStack_70,auVar72._0_2_);
                        auVar211._4_12_ = auVar44;
                        auVar264._0_12_ = auVar93._0_12_;
                        auVar264._12_2_ = auVar93._6_2_;
                        auVar264._14_2_ = puStack_60[3];
                        auVar263._12_4_ = auVar264._12_4_;
                        auVar263._0_10_ = auVar93._0_10_;
                        auVar263._10_2_ = puStack_60[2];
                        auVar262._10_6_ = auVar263._10_6_;
                        auVar262._0_8_ = auVar93._0_8_;
                        auVar262._8_2_ = auVar93._4_2_;
                        auVar45._4_8_ = auVar262._8_8_;
                        auVar45._2_2_ = puStack_60[1];
                        auVar45._0_2_ = auVar93._2_2_;
                        auVar284._0_8_ = auVar211._0_8_;
                        auVar284._8_4_ = auVar44._0_4_;
                        auVar284._12_4_ = auVar45._0_4_;
                        *(ulong *)local_a0 =
                             CONCAT44(CONCAT22(*puStack_60,auVar93._0_2_),auVar211._0_4_);
                        *(long *)(local_a0 + 4) = auVar284._8_8_;
                        *(int *)(local_a0 + 8) = auVar212._8_4_;
                        *(int *)(local_a0 + 10) = auVar262._8_4_;
                        *(undefined4 *)(local_a0 + 0xc) = auVar213._12_4_;
                        *(undefined4 *)(local_a0 + 0xe) = auVar263._12_4_;
                        uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                        auVar70._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                        auVar70._8_2_ = auVar72._12_2_;
                        auVar70._10_2_ = uVar10;
                        auVar80._12_2_ = auVar72._14_2_;
                        auVar80._0_12_ = auVar70;
                        auVar80._14_2_ = uVar11;
                        uVar118 = CONCAT22(uVar82,auVar93._8_2_);
                        auVar125._0_8_ = CONCAT26(uVar83,CONCAT24(auVar93._10_2_,uVar118));
                        auVar125._8_2_ = auVar93._12_2_;
                        auVar125._10_2_ = uVar16;
                        auVar140._12_2_ = auVar93._14_2_;
                        auVar140._0_12_ = auVar125;
                        auVar140._14_2_ = uVar17;
                        auVar114._8_4_ = (int)((ulong)auVar70._0_8_ >> 0x20);
                        auVar114._0_8_ = auVar70._0_8_;
                        auVar114._12_4_ = (int)((ulong)auVar125._0_8_ >> 0x20);
                        auVar113._8_8_ = auVar114._8_8_;
                        auVar113._4_4_ = uVar118;
                        auVar113._0_4_ = uVar51;
                        *(undefined1 (*) [16])(local_a0 + 0x10) = auVar113;
                        *(int *)(local_a0 + 0x18) = auVar70._8_4_;
                        *(int *)(local_a0 + 0x1a) = auVar125._8_4_;
                        *(int *)(local_a0 + 0x1c) = auVar80._12_4_;
                        *(int *)(local_a0 + 0x1e) = auVar140._12_4_;
                        local_a0 = local_a0 + 0x20;
                        local_68 = local_68 + 1;
                        puStack_60 = puStack_60 + 8;
                        puStack_70 = puStack_70 + 8;
                        local_78 = (undefined1  [8])((long)local_78 + 0x10);
                      }
                    }
                  }
                  else {
                    for (; local_58 != 0; local_58 = local_58 - 1) {
                      auVar72 = *(undefined1 (*) [16])local_78;
                      uVar8 = puStack_70[4];
                      uVar9 = puStack_70[5];
                      uVar10 = puStack_70[6];
                      uVar11 = puStack_70[7];
                      auVar93 = *local_68;
                      uVar82 = puStack_60[4];
                      uVar83 = puStack_60[5];
                      uVar16 = puStack_60[6];
                      uVar17 = puStack_60[7];
                      auVar198._0_12_ = auVar72._0_12_;
                      auVar198._12_2_ = auVar72._6_2_;
                      auVar198._14_2_ = puStack_70[3];
                      auVar197._12_4_ = auVar198._12_4_;
                      auVar197._0_10_ = auVar72._0_10_;
                      auVar197._10_2_ = puStack_70[2];
                      auVar196._10_6_ = auVar197._10_6_;
                      auVar196._0_8_ = auVar72._0_8_;
                      auVar196._8_2_ = auVar72._4_2_;
                      auVar36._4_8_ = auVar196._8_8_;
                      auVar36._2_2_ = puStack_70[1];
                      auVar36._0_2_ = auVar72._2_2_;
                      auVar195._0_4_ = CONCAT22(*puStack_70,auVar72._0_2_);
                      auVar195._4_12_ = auVar36;
                      auVar252._0_12_ = auVar93._0_12_;
                      auVar252._12_2_ = auVar93._6_2_;
                      auVar252._14_2_ = puStack_60[3];
                      auVar251._12_4_ = auVar252._12_4_;
                      auVar251._0_10_ = auVar93._0_10_;
                      auVar251._10_2_ = puStack_60[2];
                      auVar250._10_6_ = auVar251._10_6_;
                      auVar250._0_8_ = auVar93._0_8_;
                      auVar250._8_2_ = auVar93._4_2_;
                      auVar37._4_8_ = auVar250._8_8_;
                      auVar37._2_2_ = puStack_60[1];
                      auVar37._0_2_ = auVar93._2_2_;
                      auVar280._0_8_ = auVar195._0_8_;
                      auVar280._8_4_ = auVar36._0_4_;
                      auVar280._12_4_ = auVar37._0_4_;
                      *(ulong *)local_a0 =
                           CONCAT44(CONCAT22(*puStack_60,auVar93._0_2_),auVar195._0_4_);
                      *(long *)(local_a0 + 4) = auVar280._8_8_;
                      *(int *)(local_a0 + 8) = auVar196._8_4_;
                      *(int *)(local_a0 + 10) = auVar250._8_4_;
                      *(undefined4 *)(local_a0 + 0xc) = auVar197._12_4_;
                      *(undefined4 *)(local_a0 + 0xe) = auVar251._12_4_;
                      uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                      auVar68._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                      auVar68._8_2_ = auVar72._12_2_;
                      auVar68._10_2_ = uVar10;
                      auVar78._12_2_ = auVar72._14_2_;
                      auVar78._0_12_ = auVar68;
                      auVar78._14_2_ = uVar11;
                      uVar118 = CONCAT22(uVar82,auVar93._8_2_);
                      auVar123._0_8_ = CONCAT26(uVar83,CONCAT24(auVar93._10_2_,uVar118));
                      auVar123._8_2_ = auVar93._12_2_;
                      auVar123._10_2_ = uVar16;
                      auVar136._12_2_ = auVar93._14_2_;
                      auVar136._0_12_ = auVar123;
                      auVar136._14_2_ = uVar17;
                      auVar108._8_4_ = (int)((ulong)auVar68._0_8_ >> 0x20);
                      auVar108._0_8_ = auVar68._0_8_;
                      auVar108._12_4_ = (int)((ulong)auVar123._0_8_ >> 0x20);
                      auVar107._8_8_ = auVar108._8_8_;
                      auVar107._4_4_ = uVar118;
                      auVar107._0_4_ = uVar51;
                      *(undefined1 (*) [16])(local_a0 + 0x10) = auVar107;
                      *(int *)(local_a0 + 0x18) = auVar68._8_4_;
                      *(int *)(local_a0 + 0x1a) = auVar123._8_4_;
                      *(int *)(local_a0 + 0x1c) = auVar78._12_4_;
                      *(int *)(local_a0 + 0x1e) = auVar136._12_4_;
                      local_a0 = local_a0 + 0x20;
                      local_68 = local_68 + 1;
                      puStack_60 = puStack_60 + 8;
                      puStack_70 = puStack_70 + 8;
                      local_78 = (undefined1  [8])((long)local_78 + 0x10);
                    }
                  }
                }
                else {
                  for (; local_58 != 0; local_58 = local_58 - 1) {
                    auVar72 = *(undefined1 (*) [16])local_78;
                    uVar8 = puStack_70[4];
                    uVar9 = puStack_70[5];
                    uVar10 = puStack_70[6];
                    uVar11 = puStack_70[7];
                    auVar93 = *local_68;
                    uVar82 = puStack_60[4];
                    uVar83 = puStack_60[5];
                    uVar16 = puStack_60[6];
                    uVar17 = puStack_60[7];
                    auVar206._0_12_ = auVar72._0_12_;
                    auVar206._12_2_ = auVar72._6_2_;
                    auVar206._14_2_ = puStack_70[3];
                    auVar205._12_4_ = auVar206._12_4_;
                    auVar205._0_10_ = auVar72._0_10_;
                    auVar205._10_2_ = puStack_70[2];
                    auVar204._10_6_ = auVar205._10_6_;
                    auVar204._0_8_ = auVar72._0_8_;
                    auVar204._8_2_ = auVar72._4_2_;
                    auVar40._4_8_ = auVar204._8_8_;
                    auVar40._2_2_ = puStack_70[1];
                    auVar40._0_2_ = auVar72._2_2_;
                    auVar203._0_4_ = CONCAT22(*puStack_70,auVar72._0_2_);
                    auVar203._4_12_ = auVar40;
                    auVar258._0_12_ = auVar93._0_12_;
                    auVar258._12_2_ = auVar93._6_2_;
                    auVar258._14_2_ = puStack_60[3];
                    auVar257._12_4_ = auVar258._12_4_;
                    auVar257._0_10_ = auVar93._0_10_;
                    auVar257._10_2_ = puStack_60[2];
                    auVar256._10_6_ = auVar257._10_6_;
                    auVar256._0_8_ = auVar93._0_8_;
                    auVar256._8_2_ = auVar93._4_2_;
                    auVar41._4_8_ = auVar256._8_8_;
                    auVar41._2_2_ = puStack_60[1];
                    auVar41._0_2_ = auVar93._2_2_;
                    auVar282._0_8_ = auVar203._0_8_;
                    auVar282._8_4_ = auVar40._0_4_;
                    auVar282._12_4_ = auVar41._0_4_;
                    *(ulong *)local_a0 =
                         CONCAT44(CONCAT22(*puStack_60,auVar93._0_2_),auVar203._0_4_);
                    *(long *)(local_a0 + 4) = auVar282._8_8_;
                    *(int *)(local_a0 + 8) = auVar204._8_4_;
                    *(int *)(local_a0 + 10) = auVar256._8_4_;
                    *(undefined4 *)(local_a0 + 0xc) = auVar205._12_4_;
                    *(undefined4 *)(local_a0 + 0xe) = auVar257._12_4_;
                    uVar51 = CONCAT22(uVar8,auVar72._8_2_);
                    auVar69._0_8_ = CONCAT26(uVar9,CONCAT24(auVar72._10_2_,uVar51));
                    auVar69._8_2_ = auVar72._12_2_;
                    auVar69._10_2_ = uVar10;
                    auVar79._12_2_ = auVar72._14_2_;
                    auVar79._0_12_ = auVar69;
                    auVar79._14_2_ = uVar11;
                    uVar118 = CONCAT22(uVar82,auVar93._8_2_);
                    auVar124._0_8_ = CONCAT26(uVar83,CONCAT24(auVar93._10_2_,uVar118));
                    auVar124._8_2_ = auVar93._12_2_;
                    auVar124._10_2_ = uVar16;
                    auVar138._12_2_ = auVar93._14_2_;
                    auVar138._0_12_ = auVar124;
                    auVar138._14_2_ = uVar17;
                    auVar111._8_4_ = (int)((ulong)auVar69._0_8_ >> 0x20);
                    auVar111._0_8_ = auVar69._0_8_;
                    auVar111._12_4_ = (int)((ulong)auVar124._0_8_ >> 0x20);
                    auVar110._8_8_ = auVar111._8_8_;
                    auVar110._4_4_ = uVar118;
                    auVar110._0_4_ = uVar51;
                    *(undefined1 (*) [16])(local_a0 + 0x10) = auVar110;
                    *(int *)(local_a0 + 0x18) = auVar69._8_4_;
                    *(int *)(local_a0 + 0x1a) = auVar124._8_4_;
                    *(int *)(local_a0 + 0x1c) = auVar79._12_4_;
                    *(int *)(local_a0 + 0x1e) = auVar138._12_4_;
                    local_a0 = local_a0 + 0x20;
                    local_68 = local_68 + 1;
                    puStack_60 = puStack_60 + 8;
                    puStack_70 = puStack_70 + 8;
                    local_78 = (undefined1  [8])((long)local_78 + 0x10);
                  }
                }
                if (local_50 != 0) {
                  lVar58 = 0;
                  do {
                    local_a0[lVar58 * 2] = *(unsigned_short *)((long)local_78 + lVar58);
                    local_a0[lVar58 * 2 + 1] = *(unsigned_short *)((long)puStack_70 + lVar58);
                    local_a0[lVar58 * 2 + 2] = *(unsigned_short *)(*local_68 + lVar58);
                    local_a0[lVar58 * 2 + 3] = *(unsigned_short *)((long)puStack_60 + lVar58);
                    lVar58 = lVar58 + 2;
                    local_50 = local_50 - 1;
                  } while (local_50 != 0);
                  puStack_70 = (unsigned_short *)((long)puStack_70 + lVar58);
                  local_78 = (undefined1  [8])((long)local_78 + lVar58);
                  local_68 = (undefined1 (*) [16])(*local_68 + lVar58);
                  puStack_60 = (undefined2 *)((long)puStack_60 + lVar58);
                }
              }
            }
          }
        }
      }
      y = y + iVar50;
    } while (y != uVar56);
  }
  return;
}

Assistant:

void
LineBufferTaskIIF::execute()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //
        
        if (_lineBuffer->uncompressedData == 0)
        {
            size_t uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);
            
            for (int i = _lineBuffer->minY - _ifd->minY;
            i <= maxY - _ifd->minY;
            ++i)
            {
                uncompressedSize += _ifd->bytesPerLine[i];
            }
            
            if (_lineBuffer->compressor &&
                static_cast<size_t>(_lineBuffer->dataSize) < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();
                
                _lineBuffer->dataSize =
                _lineBuffer->compressor->uncompress (_lineBuffer->buffer,
                                                     _lineBuffer->dataSize,
                                                     _lineBuffer->minY,
                                                     _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //
                
                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }
        
        int yStart, yStop, dy;
        
        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }
        
        for (int y = yStart; y != yStop; y += dy)
        {
            if (modp (y, _optimizationMode._ySampling) != 0)
                continue;
            
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //
            
            // Set the readPtr to read at the start of uncompressedData
            // but with an offet based on calculated array.
            // _ifd->offsetInLineBuffer contains offsets based on which
            // line we are currently processing.
            // Stride will be taken into consideration later.
                
                
            const char* readPtr = _lineBuffer->uncompressedData +
            _ifd->offsetInLineBuffer[y - _ifd->minY];
            
            size_t pixelsToCopySSE = 0;
            size_t pixelsToCopyNormal = 0;
            
            unsigned short* writePtrLeft = 0;
            unsigned short* writePtrRight = 0;
            
            size_t channels = _ifd->optimizationData.size();
       
            if(channels>4)
            {
                getWritePointerStereo<half>(y, writePtrRight, writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
            }
            else 
            {
                getWritePointer<half>(y, writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
            }
            
            if (writePtrRight == 0 && pixelsToCopySSE == 0 && pixelsToCopyNormal == 0)
            {
                continue;
            }
            
            
            //
            // support reading up to eight channels
            //
            unsigned short* readPointers[8];
            
            for (size_t i = 0; i < channels ; ++i)
            {
                readPointers[i] = (unsigned short*)readPtr + (_ifd->optimizationData[i].offset * (pixelsToCopySSE * 8 + pixelsToCopyNormal));
            }
            
            //RGB only
            if(channels==3 || channels == 6 )
            {
                    optimizedWriteToRGB(readPointers[0], readPointers[1], readPointers[2], writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                  
                    //stereo RGB
                    if( channels == 6)
                    {
                        optimizedWriteToRGB(readPointers[3], readPointers[4], readPointers[5], writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }                
            //RGBA
            }else if(channels==4 || channels==8)
            {
                
                if(_ifd->optimizationData[3].fill)
                {
                    optimizedWriteToRGBAFillA(readPointers[0], readPointers[1], readPointers[2], _ifd->optimizationData[3].fillValue.bits() , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }else{
                    optimizedWriteToRGBA(readPointers[0], readPointers[1], readPointers[2], readPointers[3] , writePtrRight, pixelsToCopySSE, pixelsToCopyNormal);
                }
                
                //stereo RGBA
                if( channels == 8)
                {
                    if(_ifd->optimizationData[7].fill)
                    {
                        optimizedWriteToRGBAFillA(readPointers[4], readPointers[5], readPointers[6], _ifd->optimizationData[7].fillValue.bits() , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }else{
                        optimizedWriteToRGBA(readPointers[4], readPointers[5], readPointers[6], readPointers[7] , writePtrLeft, pixelsToCopySSE, pixelsToCopyNormal);
                    }
                }
            }
            else {
                throw(IEX_NAMESPACE::LogicExc("IIF mode called with incorrect channel pattern"));
            }
            
            // If we are in NO_OPTIMIZATION mode, this class will never
            // get instantiated, so no need to check for it and duplicate
            // the code.
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}